

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O2

void opn2_reset(OPN2_MIDIPlayer *device)

{
  OPNMIDIplay *this;
  
  if (device == (OPN2_MIDIPlayer *)0x0) {
    return;
  }
  this = (OPNMIDIplay *)device->opn2_midiPlayer;
  if (this != (OPNMIDIplay *)0x0) {
    OPNMIDIplay::partialReset(this);
    OPNMIDIplay::resetMIDI(this);
    return;
  }
  __assert_fail("play",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                ,0x2c1,"void opn2_reset(OPN2_MIDIPlayer *)");
}

Assistant:

OPNMIDI_EXPORT void opn2_reset(OPN2_MIDIPlayer *device)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->partialReset();
    play->resetMIDI();
}